

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrgif.c
# Opt level: O0

void flush_packet(gif_dest_ptr dinfo)

{
  int iVar1;
  size_t sVar2;
  long in_RDI;
  
  if (0 < *(int *)(in_RDI + 0x78)) {
    iVar1 = *(int *)(in_RDI + 0x78);
    *(int *)(in_RDI + 0x78) = iVar1 + 1;
    *(char *)(in_RDI + 0x7c) = (char)iVar1;
    sVar2 = fwrite((void *)(in_RDI + 0x7c),1,(long)*(int *)(in_RDI + 0x78),*(FILE **)(in_RDI + 0x20)
                  );
    if (sVar2 != (long)*(int *)(in_RDI + 0x78)) {
      *(undefined4 *)(**(long **)(in_RDI + 0x38) + 0x28) = 0x25;
      (**(code **)**(undefined8 **)(in_RDI + 0x38))(*(undefined8 *)(in_RDI + 0x38));
    }
    *(undefined4 *)(in_RDI + 0x78) = 0;
  }
  return;
}

Assistant:

LOCAL(void)
flush_packet(gif_dest_ptr dinfo)
/* flush any accumulated data */
{
  if (dinfo->bytesinpkt > 0) {  /* never write zero-length packet */
    dinfo->packetbuf[0] = (char)dinfo->bytesinpkt++;
    if (JFWRITE(dinfo->pub.output_file, dinfo->packetbuf, dinfo->bytesinpkt) !=
        (size_t)dinfo->bytesinpkt)
      ERREXIT(dinfo->cinfo, JERR_FILE_WRITE);
    dinfo->bytesinpkt = 0;
  }
}